

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t zesLedSetState(zes_led_handle_t hLed,ze_bool_t enable)

{
  zes_pfnLedSetState_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnLedSetState_t pfnSetState;
  ze_bool_t enable_local;
  zes_led_handle_t hLed_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Led).pfnSetState;
    if (p_Var1 == (zes_pfnLedSetState_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hLed_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hLed_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hLed_local._4_4_ = (*p_Var1)(hLed,enable);
    }
  }
  else {
    hLed_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hLed_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesLedSetState(
    zes_led_handle_t hLed,                          ///< [in] Handle for the component.
    ze_bool_t enable                                ///< [in] Set to TRUE to turn the LED on, FALSE to turn off.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnLedSetState_t pfnSetState = [&result] {
        auto pfnSetState = ze_lib::context->zesDdiTable.load()->Led.pfnSetState;
        if( nullptr == pfnSetState ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnSetState;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnSetState( hLed, enable );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnSetState = ze_lib::context->zesDdiTable.load()->Led.pfnSetState;
    if( nullptr == pfnSetState ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnSetState( hLed, enable );
    #endif
}